

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

void __thiscall VcprojGenerator::initLinkerTool(VcprojGenerator *this)

{
  QStringList *this_00;
  QStringList *this_01;
  QString *pQVar1;
  QMakeProject *pQVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  bool bVar6;
  ProStringList *pPVar7;
  long lVar8;
  ProString *lib;
  ProString *this_02;
  long lVar9;
  long in_FS_OFFSET;
  QAnyStringView QVar10;
  ProKey local_b8;
  QString local_88;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_LFLAGS");
  pPVar7 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_68);
  VCToolBase::parseOptions(&(this->vcProject).Configuration.linker.super_VCToolBase,pPVar7);
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_68,"DEF_FILE");
  pPVar7 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&local_68);
  lVar8 = (pPVar7->super_QList<ProString>).d.size;
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (lVar8 != 0) {
    pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_b8,"DEF_FILE");
    QMakeEvaluator::first(&local_68,&pQVar2->super_QMakeEvaluator,&local_b8);
    ProString::toQString(&local_88,&local_68);
    pQVar3 = &((this->vcProject).Configuration.linker.ModuleDefinitionFile.d.d)->super_QArrayData;
    pcVar4 = (this->vcProject).Configuration.linker.ModuleDefinitionFile.d.ptr;
    (this->vcProject).Configuration.linker.ModuleDefinitionFile.d.d = local_88.d.d;
    (this->vcProject).Configuration.linker.ModuleDefinitionFile.d.ptr = local_88.d.ptr;
    qVar5 = (this->vcProject).Configuration.linker.ModuleDefinitionFile.d.size;
    (this->vcProject).Configuration.linker.ModuleDefinitionFile.d.size = local_88.d.size;
    local_88.d.d = (Data *)pQVar3;
    local_88.d.ptr = pcVar4;
    local_88.d.size = qVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  this_00 = &(this->vcProject).Configuration.linker.AdditionalDependencies;
  this_01 = &(this->vcProject).Configuration.linker.AdditionalLibraryDirectories;
  lVar8 = 0;
  do {
    local_b8.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)&local_68,initLinkerTool::lflags[lVar8]);
    MakefileGenerator::fixLibFlags
              ((ProStringList *)&local_b8,(MakefileGenerator *)this,(ProKey *)&local_68);
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((undefined1 *)local_b8.super_ProString.m_string.d.size != (undefined1 *)0x0) {
      lVar9 = local_b8.super_ProString.m_string.d.size * 0x30;
      this_02 = (ProString *)local_b8.super_ProString.m_string.d.ptr;
      do {
        bVar6 = ProString::startsWith(this_02,"/LIBPATH:",CaseSensitive);
        if (bVar6) {
          ProString::mid(&local_68,this_02,9,-1);
          ProString::toQString(&local_88,&local_68);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)this_01,
                     (this->vcProject).Configuration.linker.AdditionalLibraryDirectories.d.size,
                     &local_88);
          QList<QString>::end(this_01);
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else {
          ProString::toQString(&local_68.m_string,this_02);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)this_00,
                     (this->vcProject).Configuration.linker.AdditionalDependencies.d.size,
                     &local_68.m_string);
          QList<QString>::end(this_00);
        }
        if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        this_02 = this_02 + 1;
        lVar9 = lVar9 + -0x30;
      } while (lVar9 != 0);
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_b8);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  pQVar1 = &(this->vcProject).Configuration.linker.OutputFile;
  QVar10.m_size = (size_t)"$(OutDir)\\";
  QVar10.field_0.m_data_utf8 = (char *)pQVar1;
  QString::assign(QVar10);
  pQVar2 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_b8,"MSVCPROJ_TARGET");
  QMakeEvaluator::first(&local_68,&pQVar2->super_QMakeEvaluator,&local_b8);
  ProString::toQString(&local_88,&local_68);
  QString::append((QString *)pQVar1);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initLinkerTool()
{
    VCConfiguration &conf = vcProject.Configuration;
    conf.linker.parseOptions(project->values("QMAKE_LFLAGS"));

    if (!project->values("DEF_FILE").isEmpty())
        conf.linker.ModuleDefinitionFile = project->first("DEF_FILE").toQString();

    static const char * const lflags[] = { "LIBS", "LIBS_PRIVATE",
                                           "QMAKE_LIBS", "QMAKE_LIBS_PRIVATE", nullptr };
    for (int i = 0; lflags[i]; i++) {
        const auto libs = fixLibFlags(lflags[i]);
        for (const ProString &lib : libs) {
            if (lib.startsWith("/LIBPATH:"))
                conf.linker.AdditionalLibraryDirectories << lib.mid(9).toQString();
            else
                conf.linker.AdditionalDependencies << lib.toQString();
        }
    }

    conf.linker.OutputFile = "$(OutDir)\\";
    conf.linker.OutputFile += project->first("MSVCPROJ_TARGET").toQString();
}